

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O1

Error asmjit::Logging::formatLine
                (StringBuilder *sb,uint8_t *binData,size_t binLen,size_t dispLen,size_t imLen,
                char *comment)

{
  byte bVar1;
  size_t sVar2;
  bool bVar3;
  Error EVar4;
  uint uVar5;
  CodeEmitter *emitter;
  char *str;
  size_t i;
  size_t len;
  int iVar6;
  ulong uVar7;
  Error unaff_R15D;
  char local_71;
  ulong local_70;
  ulong local_68;
  
  len = 0;
  if (comment != (char *)0x0) {
    do {
      if (comment[len] == '\0') goto LAB_001164f8;
      len = len + 1;
    } while (len != 0x200);
    len = 0x200;
  }
LAB_001164f8:
  if (dispLen <= binLen) {
    if (binLen - 1 < 0xfffffffffffffffe || len != 0) {
      local_70 = sb->_length;
      uVar7 = (ulong)(binLen == 0xffffffffffffffff);
      local_71 = ';';
      local_68 = 0x28;
      do {
        sVar2 = sb->_length;
        if (local_68 < local_70 || local_68 - local_70 == 0) {
LAB_001165a3:
          iVar6 = 1;
          EVar4 = StringBuilder::_opChar(sb,1,local_71);
          if (EVar4 != 0) goto LAB_001165e3;
          iVar6 = 1;
          EVar4 = StringBuilder::_opChar(sb,1,' ');
          if (EVar4 != 0) goto LAB_001165e3;
          iVar6 = 1;
          if (uVar7 == 0) {
            EVar4 = StringBuilder::_opHex(sb,1,binData,binLen - (dispLen + imLen));
            if (EVar4 == 0) {
              iVar6 = 1;
              EVar4 = StringBuilder::_opChars(sb,1,'.',dispLen * 2);
              if (EVar4 == 0) {
                iVar6 = 1;
                EVar4 = StringBuilder::_opHex(sb,1,binData + (binLen - imLen),imLen);
                if (EVar4 == 0) {
                  if (len != 0) goto LAB_00116627;
                  iVar6 = 4;
                  EVar4 = unaff_R15D;
                }
              }
            }
            goto LAB_001165e3;
          }
          EVar4 = StringBuilder::_opString(sb,1,comment,len);
          if (EVar4 != 0) goto LAB_001165e3;
LAB_00116627:
          local_70 = (local_70 - sVar2) + sb->_length;
          local_68 = local_68 + 0x1a;
          local_71 = '|';
          iVar6 = 0;
          bVar3 = true;
        }
        else {
          iVar6 = 1;
          EVar4 = StringBuilder::_opChars(sb,1,' ',local_68 - local_70);
          if (EVar4 == 0) goto LAB_001165a3;
LAB_001165e3:
          bVar3 = false;
          unaff_R15D = EVar4;
        }
        if (!bVar3) goto LAB_001166cd;
        uVar7 = uVar7 + 1;
      } while (uVar7 == 1);
      iVar6 = 4;
LAB_001166cd:
      if (iVar6 != 4) {
        return unaff_R15D;
      }
    }
    EVar4 = StringBuilder::_opChar(sb,1,'\n');
    return EVar4;
  }
  formatLine();
  uVar5 = (uint)dispLen;
  uVar7 = dispLen & 0xffffffff;
  if (uVar5 < 0x1000000) {
    str = "void";
  }
  else if ((int)(uVar7 >> 0x18) - 0x20U < 0x45) {
    if ((int)uVar5 < 0) {
      formatFuncDetailValue();
LAB_00116852:
      formatFuncDetailValue();
      if (_ZZN6asmjitL19OSUtils_GetVMemInfoEvE3vmi_0 == 0) {
        OSUtils::getVirtualMemoryInfo();
      }
      return (Error)_ZZN6asmjitL19OSUtils_GetVMemInfoEvE3vmi_0;
    }
    bVar1 = TypeId::_info[(uVar7 >> 0x18) + 0x80];
    if ((byte)(bVar1 - 0x20) < 0x13) {
      str = &DAT_00135294 + *(int *)(&DAT_00135294 + (ulong)(byte)(bVar1 - 0x20) * 4);
    }
    else {
      str = "unknown";
    }
    if ((char)bVar1 < '\0') goto LAB_00116852;
    if ((byte)TypeId::_info[bVar1] < (byte)TypeId::_info[uVar7 >> 0x18]) {
      EVar4 = StringBuilder::appendFormat
                        (sb,"%sx%u",str,
                         (ulong)((byte)TypeId::_info[uVar7 >> 0x18] / (byte)TypeId::_info[bVar1]));
      goto LAB_001167bf;
    }
  }
  else {
    str = "unknown";
  }
  EVar4 = StringBuilder::_opString(sb,1,str,0xffffffffffffffff);
LAB_001167bf:
  if (((EVar4 == 0) &&
      (((uVar5 >> 0x10 & 1) == 0 ||
       ((EVar4 = StringBuilder::_opChar(sb,1,':'), EVar4 == 0 &&
        (EVar4 = X86Logging::formatRegister
                           (sb,(uint32_t)binData,emitter,
                            (uint)(emitter->_codeInfo)._archInfo.field_0.field_0._type,
                            (uint)(uVar7 >> 8) & 0xff,uVar5 & 0xff), EVar4 == 0)))))) &&
     (((uVar5 >> 0x11 & 1) == 0 ||
      (EVar4 = StringBuilder::appendFormat(sb,":[%d]",dispLen & 0xffff), EVar4 == 0)))) {
    EVar4 = 0;
  }
  return EVar4;
}

Assistant:

Error Logging::formatLine(StringBuilder& sb, const uint8_t* binData, size_t binLen, size_t dispLen, size_t imLen, const char* comment) noexcept {
  size_t currentLen = sb.getLength();
  size_t commentLen = comment ? Utils::strLen(comment, kMaxCommentLength) : 0;

  ASMJIT_ASSERT(binLen >= dispLen);

  if ((binLen != 0 && binLen != Globals::kInvalidIndex) || commentLen) {
    size_t align = kMaxInstLength;
    char sep = ';';

    for (size_t i = (binLen == Globals::kInvalidIndex); i < 2; i++) {
      size_t begin = sb.getLength();

      // Append align.
      if (currentLen < align)
        ASMJIT_PROPAGATE(sb.appendChars(' ', align - currentLen));

      // Append separator.
      if (sep) {
        ASMJIT_PROPAGATE(sb.appendChar(sep));
        ASMJIT_PROPAGATE(sb.appendChar(' '));
      }

      // Append binary data or comment.
      if (i == 0) {
        ASMJIT_PROPAGATE(sb.appendHex(binData, binLen - dispLen - imLen));
        ASMJIT_PROPAGATE(sb.appendChars('.', dispLen * 2));
        ASMJIT_PROPAGATE(sb.appendHex(binData + binLen - imLen, imLen));
        if (commentLen == 0) break;
      }
      else {
        ASMJIT_PROPAGATE(sb.appendString(comment, commentLen));
      }

      currentLen += sb.getLength() - begin;
      align += kMaxBinaryLength;
      sep = '|';
    }
  }

  return sb.appendChar('\n');
}